

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameTableFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3 *db;
  FKey *pFVar1;
  int iVar2;
  int iVar3;
  RenameToken *pToken;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  i64 iVar7;
  RenameToken *pRVar8;
  RenameToken *pRVar9;
  RenameToken *pRVar10;
  RenameToken **ppRVar11;
  Trigger *pTrigger;
  uint uVar12;
  TriggerStep *pTVar13;
  RenameCtx sCtx;
  Parse sParse;
  RenameCtx local_298;
  char *local_278;
  sqlite3_context *local_270;
  char *local_268;
  char *local_260;
  Trigger *local_258;
  sqlite3_xauth local_250;
  char *local_248;
  sqlite3_value **local_240;
  Walker local_238;
  Parse local_208;
  NameContext local_68;
  
  db = context->pOut->db;
  local_268 = (char *)sqlite3ValueText(*argv,'\x01');
  pcVar4 = (char *)sqlite3ValueText(argv[3],'\x01');
  pcVar5 = (char *)sqlite3ValueText(argv[4],'\x01');
  pcVar6 = (char *)sqlite3ValueText(argv[5],'\x01');
  local_240 = argv;
  iVar7 = sqlite3VdbeIntValue(argv[6]);
  if (pcVar6 == (char *)0x0 || (pcVar5 == (char *)0x0 || pcVar4 == (char *)0x0)) {
    return;
  }
  local_250 = db->xAuth;
  db->xAuth = (sqlite3_xauth)0x0;
  local_278 = pcVar5;
  local_270 = context;
  local_260 = pcVar4;
  local_248 = pcVar6;
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  pcVar5 = local_268;
  pcVar4 = local_278;
  local_298.pTab = (Table *)0x0;
  local_298.zOld = (char *)0x0;
  local_298.pList = (RenameToken *)0x0;
  local_298.nList = 0;
  local_298.iCol = 0;
  local_298.pTab = sqlite3FindTable(db,local_278,local_268);
  local_238.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_238.walkerDepth = 0;
  local_238.eCode = '\0';
  local_238._37_3_ = 0;
  local_238.xExprCallback = renameTableExprCb;
  local_238.xSelectCallback = renameTableSelectCb;
  local_238.pParse = &local_208;
  local_238.u.pNC = (NameContext *)&local_298;
  iVar2 = renameParseSql(&local_208,pcVar5,1,db,local_260,(int)iVar7);
  if (iVar2 == 0) {
    pcVar6 = (char *)db->flags;
    uVar12 = (uint)pcVar6;
    if (local_208.pNewTable == (Table *)0x0) {
      if (local_208.pNewIndex == (Index *)0x0) {
        pcVar6 = (local_208.pNewTrigger)->table;
        pTrigger = local_208.pNewTrigger;
        if (pcVar6 != (char *)0x0) {
          local_258 = local_208.pNewTrigger;
          iVar2 = sqlite3StrICmp(pcVar6,pcVar4);
          pTrigger = local_258;
          if ((iVar2 == 0) &&
             (local_208.pRename != (RenameToken *)0x0 &&
              (local_298.pTab)->pSchema == local_258->pTabSchema)) {
            pRVar8 = local_208.pRename;
            if ((char *)(local_208.pRename)->p == pcVar6) {
              ppRVar11 = &local_208.pRename;
            }
            else {
              do {
                pRVar10 = pRVar8;
                pRVar8 = pRVar10->pNext;
                if (pRVar8 == (RenameToken *)0x0) goto LAB_00198773;
              } while ((char *)pRVar8->p != pcVar6);
              ppRVar11 = &pRVar10->pNext;
            }
            *ppRVar11 = pRVar8->pNext;
            pRVar8->pNext = local_298.pList;
            local_298.nList = local_298.nList + 1;
            local_298.pList = pRVar8;
          }
        }
LAB_00198773:
        if ((uVar12 >> 0x1a & 1) == 0) {
          pcVar4 = (char *)0x0;
          if ((int)iVar7 == 0) {
            pcVar4 = pcVar5;
          }
          iVar2 = renameResolveTrigger(&local_208,pcVar4);
          if (iVar2 != 0) goto LAB_00198852;
          renameWalkTrigger(&local_238,pTrigger);
          pTVar13 = pTrigger->step_list;
          if (pTVar13 != (TriggerStep *)0x0) {
            pRVar8 = local_298.pList;
            iVar2 = local_298.nList;
            do {
              pcVar4 = pTVar13->zTarget;
              if ((pcVar4 != (char *)0x0) &&
                 (iVar3 = sqlite3StrICmp(pcVar4,local_278),
                 local_208.pRename != (RenameToken *)0x0 && iVar3 == 0)) {
                pRVar10 = local_208.pRename;
                ppRVar11 = &local_208.pRename;
                if ((char *)(local_208.pRename)->p != pcVar4) {
                  do {
                    pRVar9 = pRVar10;
                    pRVar10 = pRVar9->pNext;
                    if (pRVar10 == (RenameToken *)0x0) goto LAB_00198824;
                  } while ((char *)pRVar10->p != pcVar4);
                  ppRVar11 = &pRVar9->pNext;
                }
                *ppRVar11 = pRVar10->pNext;
                pRVar10->pNext = pRVar8;
                iVar2 = iVar2 + 1;
                local_298.nList = iVar2;
                pRVar8 = pRVar10;
                local_298.pList = pRVar10;
              }
LAB_00198824:
              pTVar13 = pTVar13->pNext;
            } while (pTVar13 != (TriggerStep *)0x0);
          }
        }
      }
      else {
        if (local_208.pRename != (RenameToken *)0x0) {
          if ((char *)(local_208.pRename)->p == (local_208.pNewIndex)->zName) {
            ppRVar11 = &local_208.pRename;
            pRVar8 = local_208.pRename;
          }
          else {
            do {
              pRVar8 = local_208.pRename;
              local_208.pRename = pRVar8->pNext;
              if (local_208.pRename == (RenameToken *)0x0) goto LAB_00198701;
            } while ((char *)(local_208.pRename)->p != (local_208.pNewIndex)->zName);
            ppRVar11 = &pRVar8->pNext;
            pRVar8 = local_208.pRename;
          }
          *ppRVar11 = pRVar8->pNext;
          pRVar8->pNext = local_298.pList;
          local_298.nList = local_298.nList + 1;
          local_298.pList = pRVar8;
        }
LAB_00198701:
        if (((uVar12 >> 0x1a & 1) == 0) && ((local_208.pNewIndex)->pPartIdxWhere != (Expr *)0x0)) {
          walkExpr(&local_238,(local_208.pNewIndex)->pPartIdxWhere);
        }
      }
    }
    else if ((local_208.pNewTable)->pSelect == (Select *)0x0) {
      local_268 = pcVar6;
      if (((byte)((ulong)pcVar6 >> 0x1a) & 0x3f & (uVar12 >> 0xe & 1) == 0) == 0) {
        pRVar8 = local_298.pList;
        iVar2 = local_298.nList;
        for (pFVar1 = (local_208.pNewTable)->pFKey; pFVar1 != (FKey *)0x0;
            pFVar1 = pFVar1->pNextFrom) {
          pcVar4 = pFVar1->zTo;
          if ((pcVar4 != (char *)0x0) &&
             (iVar3 = sqlite3StrICmp(pcVar4,local_278),
             local_208.pRename != (RenameToken *)0x0 && iVar3 == 0)) {
            ppRVar11 = &local_208.pRename;
            pRVar10 = local_208.pRename;
            if ((char *)(local_208.pRename)->p != pcVar4) {
              do {
                pRVar9 = pRVar10;
                pRVar10 = pRVar9->pNext;
                if (pRVar10 == (RenameToken *)0x0) goto LAB_001985dd;
              } while ((char *)pRVar10->p != pcVar4);
              ppRVar11 = &pRVar9->pNext;
            }
            *ppRVar11 = pRVar10->pNext;
            pRVar10->pNext = pRVar8;
            iVar2 = iVar2 + 1;
            local_298.nList = iVar2;
            pRVar8 = pRVar10;
            local_298.pList = pRVar10;
          }
LAB_001985dd:
        }
      }
      pcVar4 = (local_208.pNewTable)->zName;
      if ((pcVar4 != (char *)0x0) && (iVar2 = sqlite3StrICmp(local_278,pcVar4), iVar2 == 0)) {
        local_298.pTab = local_208.pNewTable;
        if (((uint)local_268 >> 0x1a & 1) == 0) {
          sqlite3WalkExprList(&local_238,(local_208.pNewTable)->pCheck);
          pcVar4 = (local_208.pNewTable)->zName;
        }
        if (local_208.pRename != (RenameToken *)0x0) {
          if ((char *)(local_208.pRename)->p == pcVar4) {
            ppRVar11 = &local_208.pRename;
            pRVar8 = local_208.pRename;
          }
          else {
            do {
              pRVar8 = local_208.pRename;
              local_208.pRename = pRVar8->pNext;
              if (local_208.pRename == (RenameToken *)0x0) goto LAB_0019882e;
            } while ((char *)(local_208.pRename)->p != pcVar4);
            ppRVar11 = &pRVar8->pNext;
            pRVar8 = local_208.pRename;
          }
          *ppRVar11 = pRVar8->pNext;
          pRVar8->pNext = local_298.pList;
          local_298.nList = local_298.nList + 1;
          local_298.pList = pRVar8;
        }
      }
    }
    else if ((uVar12 >> 0x1a & 1) == 0) {
      local_68.ncFlags = 0;
      local_68._42_6_ = 0;
      local_68.pWinSelect = (Select *)0x0;
      local_68.pNext = (NameContext *)0x0;
      local_68.nRef = 0;
      local_68.nErr = 0;
      local_68.pSrcList = (SrcList *)0x0;
      local_68.uNC.pEList = (ExprList *)0x0;
      local_68.pParse = &local_208;
      sqlite3SelectPrep(&local_208,(local_208.pNewTable)->pSelect,&local_68);
      sqlite3WalkSelect(&local_238,(local_208.pNewTable)->pSelect);
      iVar2 = local_208.rc;
      if (local_208.rc != 0 && local_208.nErr != 0) goto LAB_00198852;
    }
LAB_0019882e:
    iVar2 = renameEditSql(local_270,&local_298,local_260,local_248,1);
    if (iVar2 == 0) goto LAB_0019888d;
  }
LAB_00198852:
  if (local_208.zErrMsg == (char *)0x0) {
    sqlite3_result_error_code(local_270,iVar2);
  }
  else {
    renameColumnParseError(local_270,0,local_240[1],local_240[2],&local_208);
  }
LAB_0019888d:
  renameParseCleanup(&local_208);
  pRVar8 = local_298.pList;
  while (pRVar8 != (RenameToken *)0x0) {
    pRVar10 = pRVar8->pNext;
    sqlite3DbFreeNN(db,pRVar8);
    pRVar8 = pRVar10;
  }
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  db->xAuth = local_250;
  return;
}

Assistant:

static void renameTableFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zDb = (const char*)sqlite3_value_text(argv[0]);
  const char *zInput = (const char*)sqlite3_value_text(argv[3]);
  const char *zOld = (const char*)sqlite3_value_text(argv[4]);
  const char *zNew = (const char*)sqlite3_value_text(argv[5]);
  int bTemp = sqlite3_value_int(argv[6]);
  UNUSED_PARAMETER(NotUsed);

  if( zInput && zOld && zNew ){
    Parse sParse;
    int rc;
    int bQuote = 1;
    RenameCtx sCtx;
    Walker sWalker;

#ifndef SQLITE_OMIT_AUTHORIZATION
    sqlite3_xauth xAuth = db->xAuth;
    db->xAuth = 0;
#endif

    sqlite3BtreeEnterAll(db);

    memset(&sCtx, 0, sizeof(RenameCtx));
    sCtx.pTab = sqlite3FindTable(db, zOld, zDb);
    memset(&sWalker, 0, sizeof(Walker));
    sWalker.pParse = &sParse;
    sWalker.xExprCallback = renameTableExprCb;
    sWalker.xSelectCallback = renameTableSelectCb;
    sWalker.u.pRename = &sCtx;

    rc = renameParseSql(&sParse, zDb, 1, db, zInput, bTemp);

    if( rc==SQLITE_OK ){
      int isLegacy = (db->flags & SQLITE_LegacyAlter);
      if( sParse.pNewTable ){
        Table *pTab = sParse.pNewTable;

        if( pTab->pSelect ){
          if( isLegacy==0 ){
            NameContext sNC;
            memset(&sNC, 0, sizeof(sNC));
            sNC.pParse = &sParse;

            sqlite3SelectPrep(&sParse, pTab->pSelect, &sNC);
            if( sParse.nErr ) rc = sParse.rc;
            sqlite3WalkSelect(&sWalker, pTab->pSelect);
          }
        }else{
          /* Modify any FK definitions to point to the new table. */
#ifndef SQLITE_OMIT_FOREIGN_KEY
          if( isLegacy==0 || (db->flags & SQLITE_ForeignKeys) ){
            FKey *pFKey;
            for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
              if( sqlite3_stricmp(pFKey->zTo, zOld)==0 ){
                renameTokenFind(&sParse, &sCtx, (void*)pFKey->zTo);
              }
            }
          }
#endif

          /* If this is the table being altered, fix any table refs in CHECK
          ** expressions. Also update the name that appears right after the
          ** "CREATE [VIRTUAL] TABLE" bit. */
          if( sqlite3_stricmp(zOld, pTab->zName)==0 ){
            sCtx.pTab = pTab;
            if( isLegacy==0 ){
              sqlite3WalkExprList(&sWalker, pTab->pCheck);
            }
            renameTokenFind(&sParse, &sCtx, pTab->zName);
          }
        }
      }

      else if( sParse.pNewIndex ){
        renameTokenFind(&sParse, &sCtx, sParse.pNewIndex->zName);
        if( isLegacy==0 ){
          sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
        }
      }

#ifndef SQLITE_OMIT_TRIGGER
      else{
        Trigger *pTrigger = sParse.pNewTrigger;
        TriggerStep *pStep;
        if( 0==sqlite3_stricmp(sParse.pNewTrigger->table, zOld) 
            && sCtx.pTab->pSchema==pTrigger->pTabSchema
          ){
          renameTokenFind(&sParse, &sCtx, sParse.pNewTrigger->table);
        }

        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse, bTemp ? 0 : zDb);
          if( rc==SQLITE_OK ){
            renameWalkTrigger(&sWalker, pTrigger);
            for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
              if( pStep->zTarget && 0==sqlite3_stricmp(pStep->zTarget, zOld) ){
                renameTokenFind(&sParse, &sCtx, pStep->zTarget);
              }
            }
          }
        }
      }
#endif
    }

    if( rc==SQLITE_OK ){
      rc = renameEditSql(context, &sCtx, zInput, zNew, bQuote);
    }
    if( rc!=SQLITE_OK ){
      if( sParse.zErrMsg ){
        renameColumnParseError(context, 0, argv[1], argv[2], &sParse);
      }else{
        sqlite3_result_error_code(context, rc);
      }
    }

    renameParseCleanup(&sParse);
    renameTokenFree(db, sCtx.pList);
    sqlite3BtreeLeaveAll(db);
#ifndef SQLITE_OMIT_AUTHORIZATION
    db->xAuth = xAuth;
#endif
  }

  return;
}